

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O0

int ftpcccmethod(OperationConfig *config,char *str)

{
  int iVar1;
  char *str_local;
  OperationConfig *config_local;
  
  iVar1 = curl_strequal("passive",str);
  if (iVar1 == 0) {
    iVar1 = curl_strequal("active",str);
    if (iVar1 == 0) {
      warnf(config->global,"unrecognized ftp CCC method \'%s\', using default\n",str);
      config_local._4_4_ = 1;
    }
    else {
      config_local._4_4_ = 2;
    }
  }
  else {
    config_local._4_4_ = 1;
  }
  return config_local._4_4_;
}

Assistant:

int ftpcccmethod(struct OperationConfig *config, const char *str)
{
  if(curl_strequal("passive", str))
    return CURLFTPSSL_CCC_PASSIVE;
  if(curl_strequal("active", str))
    return CURLFTPSSL_CCC_ACTIVE;

  warnf(config->global, "unrecognized ftp CCC method '%s', using default\n",
        str);

  return CURLFTPSSL_CCC_PASSIVE;
}